

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLimiter.cpp
# Opt level: O0

void TestWithEvenLoad(int maxAllowedRps)

{
  bool bVar1;
  bool local_129;
  Code local_120;
  Code local_11c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_118;
  Code local_110;
  Code local_10c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_108;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_100;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  time_point lastValidRequestTime;
  Code local_e8;
  Code local_e4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_e0;
  Code result;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d0;
  time_point startTime;
  int local_c0;
  int requestsSent;
  int iterations;
  int local_ac;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  duration<long,_std::ratio<1L,_1L>_> intervalBetweenRequests;
  Limiter limiter;
  int maxAllowedRps_local;
  
  Limiter::Limiter((Limiter *)&intervalBetweenRequests,maxAllowedRps,100);
  local_ac = maxAllowedRps * 2;
  local_a8 = std::chrono::operator/(&oneSecond,&local_ac);
  for (local_c0 = 0; local_c0 < 5; local_c0 = local_c0 + 1) {
    startTime.__d.__r._4_4_ = 0;
    local_d0.__d.__r = (duration)CurrentTime();
    while( true ) {
      local_129 = false;
      if (startTime.__d.__r._4_4_ < maxAllowedRps) {
        local_d8.__d.__r = (duration)CurrentTime();
        tStack_e0 = std::chrono::operator+(&local_d0,&oneSecond);
        local_129 = std::chrono::operator<(&local_d8,&stack0xffffffffffffff20);
      }
      if (local_129 == false) break;
      startTime.__d.__r._4_4_ = startTime.__d.__r._4_4_ + 1;
      local_e4 = Limiter::ValidateRequest((Limiter *)&intervalBetweenRequests);
      local_e8 = Limiter::ValidateRequest((Limiter *)&intervalBetweenRequests);
      lastValidRequestTime.__d.__r._4_4_ = 200;
      AssertEqual<HttpResult::Code,HttpResult::Code>
                (&local_e8,(Code *)((long)&lastValidRequestTime.__d.__r + 4),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/TestLimiter.cpp"
                 ,0x74);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_a8);
    }
    local_f8.__d.__r = (duration)CurrentTime();
    while( true ) {
      local_100.__d.__r = (duration)CurrentTime();
      local_108 = std::chrono::operator+(&local_d0,&oneSecond);
      bVar1 = std::chrono::operator<(&local_100,&local_108);
      if (!bVar1) break;
      local_10c = Limiter::ValidateRequest((Limiter *)&intervalBetweenRequests);
      local_110 = TooManyRequests;
      AssertEqual<HttpResult::Code,HttpResult::Code>
                (&local_10c,&local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/TestLimiter.cpp"
                 ,0x7b);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_a8);
    }
    local_118 = std::chrono::operator+(&local_f8,&oneSecond);
    std::this_thread::
    sleep_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&local_118);
    local_11c = Limiter::ValidateRequest((Limiter *)&intervalBetweenRequests);
    local_120 = Ok;
    AssertEqual<HttpResult::Code,HttpResult::Code>
              (&local_11c,&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/TestLimiter.cpp"
               ,0x80);
  }
  Limiter::~Limiter((Limiter *)&intervalBetweenRequests);
  return;
}

Assistant:

static auto TestWithEvenLoad(int maxAllowedRps)
{
    Limiter limiter(maxAllowedRps, 100);
    const auto intervalBetweenRequests = oneSecond / (2 * maxAllowedRps);

    for (int iterations = 0; iterations < 5; ++iterations)
    {
        int requestsSent = 0;
        const auto startTime = CurrentTime();

        while (requestsSent < maxAllowedRps &&
               CurrentTime() < startTime + oneSecond)
        {
            ++requestsSent;
            const auto result = limiter.ValidateRequest();

            ASSERT_EQUAL(limiter.ValidateRequest(), HttpResult::Code::Ok);
            std::this_thread::sleep_for(intervalBetweenRequests);
        }
        const auto lastValidRequestTime = CurrentTime();

        while (CurrentTime() < startTime + oneSecond)
        {
            ASSERT_EQUAL(limiter.ValidateRequest(), HttpResult::Code::TooManyRequests);
            std::this_thread::sleep_for(intervalBetweenRequests);
        }

        std::this_thread::sleep_until(lastValidRequestTime + oneSecond);
        ASSERT_EQUAL(limiter.ValidateRequest(), HttpResult::Code::Ok);
    }
}